

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void pbrt::LogFatal<char_const(&)[89]>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [89])

{
  string s;
  string local_40;
  
  StringPrintf<char_const(&)[89]>(&local_40,(pbrt *)fmt,*args,(char (*) [89])fmt);
  LogFatal(level,file,line,local_40._M_dataplus._M_p);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}